

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O3

SiameseResult __thiscall siamese::Encoder::Get(Encoder *this,SiameseOriginalPacket *originalOut)

{
  OriginalPacket *pOVar1;
  EncoderSubwindow *pEVar2;
  SiameseResult SVar3;
  uint uVar4;
  uint uVar5;
  
  SVar3 = Siamese_Disabled;
  if ((this->Window).EmergencyDisabled == false) {
    uVar4 = originalOut->PacketNum - (this->Window).ColumnStart;
    uVar5 = uVar4 & 0x3fffff;
    if (uVar5 < (this->Window).Count) {
      uVar4 = uVar4 & 0x3f;
      pEVar2 = (this->Window).Subwindows.DataPtr[uVar5 >> 6];
      uVar5 = (pEVar2->Originals)._M_elems[uVar4].Buffer.Bytes;
      if (uVar5 != 0) {
        pOVar1 = (pEVar2->Originals)._M_elems + uVar4;
        uVar4 = pOVar1->HeaderBytes;
        originalOut->PacketNum = pOVar1->Column;
        uVar5 = uVar5 - uVar4;
        originalOut->Data = (pOVar1->Buffer).Data + uVar4;
        originalOut->DataBytes = uVar5;
        if (uVar5 != 0) {
          return Siamese_Success;
        }
        (this->Window).EmergencyDisabled = true;
        return Siamese_Disabled;
      }
    }
    SVar3 = Siamese_NeedMoreData;
    originalOut->Data = (uchar *)0x0;
    originalOut->DataBytes = 0;
  }
  return SVar3;
}

Assistant:

SiameseResult Encoder::Get(SiameseOriginalPacket& originalOut)
{
    // Note: Keep this in sync with Decoder::Get

    if (Window.EmergencyDisabled) {
        return Siamese_Disabled;
    }

    // Note: This also works when Count == 0
    SIAMESE_DEBUG_ASSERT(originalOut.PacketNum >= Window.ColumnStart);
    const unsigned element = Window.ColumnToElement(originalOut.PacketNum);
    if (Window.InvalidElement(element))
    {
        // Set default return value
        originalOut.Data      = nullptr;
        originalOut.DataBytes = 0;
        return Siamese_NeedMoreData;
    }

    // Return the packet data
    OriginalPacket* original = Window.GetWindowElement(element);
    if (original->Buffer.Bytes <= 0)
    {
        originalOut.Data      = nullptr;
        originalOut.DataBytes = 0;
        return Siamese_NeedMoreData;
    }

    SIAMESE_DEBUG_ASSERT(original->Column == originalOut.PacketNum);

    // Load original data and length
    if (0 == LoadOriginal(original, originalOut))
    {
        Window.EmergencyDisabled = true;
        return Siamese_Disabled;
    }

    return Siamese_Success;
}